

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O1

void __thiscall
PolygonTriangulation::update_xsplit_trapezoid_neighbors
          (PolygonTriangulation *this,MergeSide_t side,uint32_t left_trap_index,
          uint32_t right_trap_index)

{
  Trapezoid_t *trapezoid;
  Trapezoid_t *trapezoid_00;
  uint uVar1;
  pointer pTVar2;
  bool bVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  value_type *left_below;
  
  pTVar2 = (this->trapezoids_).
           super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  trapezoid = pTVar2 + left_trap_index;
  trapezoid_00 = pTVar2 + right_trap_index;
  if (side == MergeRight) {
    uVar1 = trapezoid_00->below1;
    uVar5 = pTVar2[uVar1].above1;
    uVar6 = pTVar2[uVar1].above2;
    if (uVar5 == right_trap_index) {
      uVar5 = 0xffffffff;
    }
    pTVar2[uVar1].above1 = uVar5;
    if (uVar6 == right_trap_index) {
      uVar6 = 0xffffffff;
    }
    pTVar2[uVar1].above2 = uVar6;
    uVar4 = (ulong)trapezoid_00->below2;
    if (uVar4 != 0xffffffff) {
      pTVar2 = (this->trapezoids_).
               super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pTVar2[uVar4].above1;
      uVar6 = pTVar2[uVar4].above2;
      if (uVar5 == right_trap_index) {
        uVar5 = 0xffffffff;
      }
      pTVar2[uVar4].above1 = uVar5;
      if (uVar6 == right_trap_index) {
        uVar6 = 0xffffffff;
      }
      pTVar2[uVar4].above2 = uVar6;
    }
    uVar5 = trapezoid->below2;
    if (uVar5 == 0xffffffff) {
      uVar5 = trapezoid->below1;
    }
    trapezoid_00->below1 = uVar5;
    trapezoid_00->below2 = 0xffffffff;
    uVar1 = trapezoid->below1;
    pTVar2 = (this->trapezoids_).
             super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pTVar2[uVar1].above1 == 0xffffffff) {
      uVar5 = 0xffffffff;
      if (pTVar2[uVar1].above2 != left_trap_index) {
        uVar5 = left_trap_index;
      }
      pTVar2[uVar1].above1 = uVar5;
    }
    else {
      pTVar2[uVar1].above2 = left_trap_index;
    }
    if ((ulong)trapezoid->below2 != 0xffffffff) {
      (this->trapezoids_).
      super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
      ._M_impl.super__Vector_impl_data._M_start[trapezoid->below2].above1 = left_trap_index;
    }
  }
  else if (side == MergeLeft) {
    uVar1 = trapezoid->below1;
    uVar5 = pTVar2[uVar1].above1;
    uVar6 = pTVar2[uVar1].above2;
    if (uVar5 == left_trap_index) {
      uVar5 = 0xffffffff;
    }
    pTVar2[uVar1].above1 = uVar5;
    if (uVar6 == left_trap_index) {
      uVar6 = 0xffffffff;
    }
    pTVar2[uVar1].above2 = uVar6;
    uVar4 = (ulong)trapezoid->below2;
    if (uVar4 != 0xffffffff) {
      pTVar2 = (this->trapezoids_).
               super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = pTVar2[uVar4].above1;
      uVar6 = pTVar2[uVar4].above2;
      if (uVar5 == left_trap_index) {
        uVar5 = 0xffffffff;
      }
      pTVar2[uVar4].above1 = uVar5;
      if (uVar6 == left_trap_index) {
        uVar6 = 0xffffffff;
      }
      pTVar2[uVar4].above2 = uVar6;
    }
    uVar1 = trapezoid->below1;
    trapezoid_00->below1 = uVar1;
    trapezoid_00->below2 = trapezoid->below2;
    trapezoid->below2 = 0xffffffff;
    (this->trapezoids_).
    super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar1].above1 = right_trap_index;
    if ((ulong)trapezoid_00->below2 != 0xffffffff) {
      (this->trapezoids_).
      super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
      ._M_impl.super__Vector_impl_data._M_start[trapezoid_00->below2].above1 = right_trap_index;
    }
  }
  else {
    uVar5 = trapezoid_00->below2;
    if (uVar5 == 0xffffffff) {
      uVar5 = trapezoid_00->below1;
    }
    trapezoid_00->below1 = uVar5;
    trapezoid->below2 = 0xffffffff;
    trapezoid_00->below2 = 0xffffffff;
    uVar1 = trapezoid->below1;
    pTVar2 = (this->trapezoids_).
             super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar1 == uVar5) {
      bVar3 = is_bottom_triangle(this,trapezoid);
      if (bVar3) {
        trapezoid->below1 = 0xffffffff;
        trapezoid->below2 = 0xffffffff;
      }
      else {
        bVar3 = is_bottom_triangle(this,trapezoid_00);
        if (bVar3) {
          trapezoid_00->below1 = 0xffffffff;
          trapezoid_00->below2 = 0xffffffff;
          pTVar2[uVar1].above1 = left_trap_index;
          uVar5 = 0xffffffff;
          if (pTVar2[uVar1].above2 != right_trap_index) {
            uVar5 = pTVar2[uVar1].above2;
          }
          pTVar2[uVar1].above2 = uVar5;
          return;
        }
        pTVar2[uVar1].above1 = left_trap_index;
      }
      pTVar2[uVar1].above2 = right_trap_index;
    }
    else {
      pTVar2[uVar1].above1 = left_trap_index;
      pTVar2[uVar1].above2 = 0xffffffff;
      uVar1 = trapezoid_00->below1;
      pTVar2 = (this->trapezoids_).
               super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2[uVar1].above1 = right_trap_index;
      pTVar2[uVar1].above2 = 0xffffffff;
    }
  }
  return;
}

Assistant:

void PolygonTriangulation::update_xsplit_trapezoid_neighbors(const MergeSide_t side,
                                                             const uint32_t left_trap_index,
                                                             const uint32_t right_trap_index)
{
  auto &left_trap = trapezoids_[left_trap_index];
  auto &right_trap = trapezoids_[right_trap_index];

  // We need 'belows' to compute trapezoids and for monotonization,
  // we need 'aboves' only for monotonization.

  if (side == MergeLeft) {

    update_trapezoid_aboves(left_trap_index, trapezoids_[left_trap.below1]);
    if (kInvalidIndex != left_trap.below2) {
      update_trapezoid_aboves(left_trap_index, trapezoids_[left_trap.below2]);
    }

    // ---------

    right_trap.below1 = left_trap.below1;
    right_trap.below2 = left_trap.below2;
    left_trap.below2 = kInvalidIndex;

    auto &right_below1 = trapezoids_[right_trap.below1];
    right_below1.above1 = right_trap_index;

    if (kInvalidIndex != right_trap.below2) {
      trapezoids_[right_trap.below2].above1 = right_trap_index;
    }
  } else if (side == MergeRight) {

    update_trapezoid_aboves(right_trap_index, trapezoids_[right_trap.below1]);
    if (kInvalidIndex != right_trap.below2) {
      update_trapezoid_aboves(right_trap_index, trapezoids_[right_trap.below2]);
    }

    // ---------

    right_trap.below1 = (kInvalidIndex != left_trap.below2) ? left_trap.below2 : left_trap.below1;
    right_trap.below2 = kInvalidIndex;

    auto &below1 = trapezoids_[left_trap.below1];
    if (below1.above1 == kInvalidIndex) {
      below1.above1 = (left_trap_index != below1.above2) ? left_trap_index : below1.above1; //
    } else {
      below1.above2 = left_trap_index;
    }

    if (kInvalidIndex != left_trap.below2) {
      trapezoids_[left_trap.below2].above1 = left_trap_index;
    }
  } else {
    right_trap.below1 = (kInvalidIndex != right_trap.below2) ? right_trap.below2 : right_trap.below1;
    left_trap.below2 = kInvalidIndex;
    right_trap.below2 = kInvalidIndex;

    // When we close the last trapezoid the below trapezoid has 2 aboves,
    // unless the vertex is already segmented.
    if (left_trap.below1 == right_trap.below1) {
      // 1) The below trapezoid is unsegmented.

      // close the trapezoid
      auto &below = trapezoids_[left_trap.below1];
      if (is_bottom_triangle(left_trap)) {
        left_trap.below1 = kInvalidIndex;
        left_trap.below2 = kInvalidIndex;
        below.above2 = right_trap_index;
      } else if (is_bottom_triangle(right_trap)) {
        right_trap.below1 = kInvalidIndex;
        right_trap.below2 = kInvalidIndex;
        below.above1 = left_trap_index;
        below.above2 = (right_trap_index != below.above2) ? below.above2 : kInvalidIndex;
      } else {
        below.above1 = left_trap_index;
        below.above2 = right_trap_index;
      }
    } else {
      // 2) The below trapezoid is segmented.

      auto &left_below = trapezoids_[left_trap.below1];
      left_below.above1 = left_trap_index;
      left_below.above2 = kInvalidIndex;

      auto &right_below = trapezoids_[right_trap.below1];
      right_below.above1 = right_trap_index;
      right_below.above2 = kInvalidIndex;
    }
  }
}